

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

Index __thiscall
PlanningUnitMADPDiscrete::GetObservationHistoryIndex
          (PlanningUnitMADPDiscrete *this,Index agentI,Index t,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *observations)

{
  Index IVar1;
  const_reference pvVar2;
  const_reference indices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  PlanningUnitMADPDiscrete *in_RDI;
  undefined4 in_stack_ffffffffffffffc8;
  Index in_stack_ffffffffffffffcc;
  undefined4 uVar3;
  
  uVar3 = in_EDX;
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::at((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
        *)in_RDI,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  pvVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::at
                     ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)in_RDI,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  IVar1 = Globals::CastLIndexToIndex(*pvVar2);
  indices = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RCX,0);
  GetNrObservations(in_RDI,in_stack_ffffffffffffffcc);
  IVar1 = ComputeHistoryIndex((PlanningUnitMADPDiscrete *)CONCAT44(in_ESI,uVar3),
                              (Index)((ulong)in_RCX >> 0x20),(Index)in_RCX,indices,
                              CONCAT44(IVar1,in_EDX));
  return IVar1;
}

Assistant:

Index PlanningUnitMADPDiscrete::GetObservationHistoryIndex(Index agentI, 
        Index t, const vector<Index>& observations) const
{
    return( ComputeHistoryIndex(
                t, 
                CastLIndexToIndex(_m_firstOHIforT.at(agentI).at(t)), 
                &observations[0],
                GetNrObservations(agentI)
                )
          );

    //observations is a vector with the observation indices for stage 0...t-1
    //<o^0, o^1, ... , o^(t-1) >
    //from this we want to find the history observation index, which is given
    //by:
    //      o^0 * |O|^(t-1) + ... + o^(t-1) * |O|^0     + stage offset
    //
    //where |O| is the `base' of the number as specified by the tuple of 
    //indices
    //
    //
    //size_t this_OHI=_m_firstOHIforT.at(agentI).at(t);
    //size_t nrO = GetNrObservations(agentI);
    //for (Index ts=0; ts<t; ts++)
    //{
        //int exponent = t-1 - ts;
        //size_t b = (size_t) pow((double)nrO, (double)(exponent));
        //this_OHI += observations.at(ts) * b;
    //}
    //return(this_OHI);
}